

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal_cast_operators.hpp
# Opt level: O3

bool duckdb::DecimalCastOperation::TruncateExcessiveDecimals<duckdb::DecimalCastData<short>,false>
               (DecimalCastData<short> *state)

{
  short sVar1;
  short sVar2;
  uint uVar3;
  ulong uVar4;
  
  uVar4 = (ulong)state->excessive_decimals;
  if (uVar4 != 0) {
    uVar3 = (uint)(ushort)state->result;
    do {
      sVar1 = (short)uVar3;
      uVar3 = (int)sVar1 / 10;
      uVar4 = uVar4 - 1;
    } while (uVar4 != 0);
    sVar2 = (short)uVar3;
    state->result = sVar2;
    if ((state->exponent_type == POSITIVE) && (4 < (short)(sVar1 + sVar2 * -10))) {
      state->result = sVar2 + 1;
    }
  }
  state->decimal_count = state->scale;
  return true;
}

Assistant:

static bool TruncateExcessiveDecimals(T &state) {
		D_ASSERT(state.excessive_decimals);
		bool round_up = false;
		for (idx_t i = 0; i < state.excessive_decimals; i++) {
			auto mod = state.result % 10;
			round_up = NEGATIVE ? mod <= -5 : mod >= 5;
			state.result /= static_cast<typename T::StoreType>(10.0);
		}
		//! Only round up when exponents are involved
		if (state.exponent_type == ExponentType::POSITIVE && round_up) {
			RoundUpResult<T, NEGATIVE>(state);
		}
		D_ASSERT(state.decimal_count > state.scale);
		state.decimal_count = state.scale;
		return true;
	}